

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O0

void slab_cache_destroy(slab_cache *cache)

{
  bool bVar1;
  size_t slab_size;
  slab *local_38;
  slab *tmp;
  slab *slab;
  rlist *slabs;
  slab_cache *cache_local;
  
  tmp = (slab *)(cache->allocated).slabs.next;
  while( true ) {
    bVar1 = false;
    if (tmp != (slab *)&cache->allocated) {
      local_38 = (slab *)(tmp->next_in_cache).next;
      bVar1 = local_38 != (slab *)0x0;
    }
    if (!bVar1) break;
    if ((uint)tmp->order == cache->order_max + 1) {
      quota_release(cache->arena->quota,tmp->size);
      free(tmp);
    }
    else {
      slab_unmap(cache->arena,tmp);
    }
    tmp = local_38;
  }
  return;
}

Assistant:

void
slab_cache_destroy(struct slab_cache *cache)
{
	struct rlist *slabs = &cache->allocated.slabs;
	/*
	 * cache->allocated contains huge allocations and
	 * slabs of the largest order. All smaller slabs are
	 * obtained from larger slabs by splitting.
	 */
	struct slab *slab, *tmp;
	rlist_foreach_entry_safe(slab, slabs, next_in_cache, tmp) {
		if (slab->order == cache->order_max + 1) {
			size_t slab_size = slab->size;
			quota_release(cache->arena->quota, slab_size);
			VALGRIND_MEMPOOL_FREE(cache, slab_data(slab));
			free(slab);
		} else {
			slab_unmap(cache->arena, slab);
		}
	}


	VALGRIND_DESTROY_MEMPOOL(cache);
}